

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

bool __thiscall CCoinsViewMemPool::GetCoin(CCoinsViewMemPool *this,COutPoint *outpoint,Coin *coin)

{
  pointer pCVar1;
  CCoinsView *pCVar2;
  int iVar3;
  const_iterator cVar4;
  undefined1 uVar5;
  long in_FS_OFFSET;
  CTransactionRef ptx;
  Coin local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_temp_added)._M_h,outpoint);
  if (cVar4.super__Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false>._M_cur ==
      (__node_type *)0x0) {
    CTxMemPool::get((CTxMemPool *)&ptx,(uint256 *)this->mempool);
    if (ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pCVar2 = (this->super_CCoinsViewBacked).base;
      iVar3 = (**pCVar2->_vptr_CCoinsView)(pCVar2,outpoint,coin);
      uVar5 = (undefined1)iVar3;
    }
    else {
      pCVar1 = ((ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)outpoint->n <
          (ulong)(((long)((ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28)) {
        CTxOut::CTxOut(&local_60.out,pCVar1 + outpoint->n);
        local_60._40_4_ = 0xfffffffe;
        Coin::operator=(coin,&local_60);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&local_60.out.scriptPubKey.super_CScriptBase);
        uVar5 = 1;
        std::
        _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<COutPoint_const&>
                  ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->m_non_base_coins,outpoint);
      }
      else {
        uVar5 = 0;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    Coin::operator=(coin,(Coin *)((long)cVar4.
                                        super__Node_iterator_base<std::pair<const_COutPoint,_Coin>,_false>
                                        ._M_cur + 0x30));
    uVar5 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewMemPool::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    // Check to see if the inputs are made available by another tx in the package.
    // These Coins would not be available in the underlying CoinsView.
    if (auto it = m_temp_added.find(outpoint); it != m_temp_added.end()) {
        coin = it->second;
        return true;
    }

    // If an entry in the mempool exists, always return that one, as it's guaranteed to never
    // conflict with the underlying cache, and it cannot have pruned entries (as it contains full)
    // transactions. First checking the underlying cache risks returning a pruned entry instead.
    CTransactionRef ptx = mempool.get(outpoint.hash);
    if (ptx) {
        if (outpoint.n < ptx->vout.size()) {
            coin = Coin(ptx->vout[outpoint.n], MEMPOOL_HEIGHT, false);
            m_non_base_coins.emplace(outpoint);
            return true;
        } else {
            return false;
        }
    }
    return base->GetCoin(outpoint, coin);
}